

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisefuture.h
# Opt level: O2

void QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
               (QFuture<void> *future,QPromiseResolve<void> *resolve,QPromiseReject<void> *reject)

{
  QFutureWatcher<void> *this;
  QFutureWatcher<void> *local_40;
  Data *local_38;
  Data *local_30;
  Object local_28 [8];
  
  this = (QFutureWatcher<void> *)operator_new(0x20);
  QFutureWatcher<void>::QFutureWatcher(this,(QObject *)0x0);
  local_38 = (reject->m_resolver).m_d.d;
  if (local_38 != (Data *)0x0) {
    LOCK();
    (local_38->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_38->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_30 = (resolve->m_resolver).m_d.d;
  if (local_30 != (Data *)0x0) {
    LOCK();
    (local_30->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_30->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_40 = this;
  QObject::
  connect<void(QFutureWatcherBase::*)(),QtPromisePrivate::PromiseFulfill<QFuture<void>>::call(QFuture<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda()_1_>
            (local_28,(offset_in_QFutureWatcherBase_to_subr)this,
             (anon_class_24_3_24552672_for_function *)QFutureWatcherBase::finished);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  PromiseFulfill<QFuture<void>>::
  call(QFuture<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#1}::~QPromiseReject((_lambda___1_ *)&local_40);
  QFutureWatcher<void>::setFuture(this,future);
  return;
}

Assistant:

static void call(const QFuture<void>& future,
                     const QtPromise::QPromiseResolve<void>& resolve,
                     const QtPromise::QPromiseReject<void>& reject)
    {
        using Watcher = QFutureWatcher<void>;

        Watcher* watcher = new Watcher{};
        QObject::connect(watcher, &Watcher::finished, [=]() mutable {
            try {
                if (watcher->isCanceled()) {
                    // let's rethrown potential exception
                    watcher->waitForFinished();
                    reject(QtPromise::QPromiseCanceledException{});
                } else {
                    resolve();
                }
            } catch (...) {
                reject(std::current_exception());
            }

            watcher->deleteLater();
        });

        watcher->setFuture(future);
    }